

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O2

iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> __thiscall
slang::ast::Scope::membersOfType<slang::ast::VariableSymbol>(Scope *this)

{
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> iVar1;
  specific_symbol_iterator<slang::ast::VariableSymbol> local_20;
  specific_symbol_iterator<slang::ast::VariableSymbol> local_18;
  
  ensureElaborated(this);
  local_18.current = this->firstMember;
  specific_symbol_iterator<slang::ast::VariableSymbol>::skipToNext(&local_18);
  local_20.current = (Symbol *)0x0;
  specific_symbol_iterator<slang::ast::VariableSymbol>::skipToNext(&local_20);
  iVar1.m_end.current = local_20.current;
  iVar1.m_begin.current = local_18.current;
  return iVar1;
}

Assistant:

iterator_range<specific_symbol_iterator<T>> membersOfType() const {
        ensureElaborated();
        return {firstMember, nullptr};
    }